

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<short,short>(random_numerators<short> *vals,short *div)

{
  random_numerators<short> *this;
  random_numerators<short> *prVar1;
  short *in_RSI;
  random_numerators<short> *in_RDI;
  const_iterator iter;
  UIntT sum;
  random_numerators<short> *prVar2;
  ushort local_12;
  
  local_12 = 0;
  this = (random_numerators<short> *)random_numerators<short>::begin(in_RDI);
  while( true ) {
    prVar2 = this;
    prVar1 = (random_numerators<short> *)random_numerators<short>::end(this);
    if (this == prVar1) break;
    local_12 = local_12 + *(short *)&prVar2->_pData / *in_RSI;
    this = (random_numerators<short> *)((long)&prVar2->_pData + 2);
  }
  return (ulong)local_12;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}